

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5TokendataIterAppendMap
               (Fts5Index *p,Fts5TokenDataIter *pT,int iIter,int nByte,i64 iRowid,i64 iPos)

{
  Fts5TokenDataMap *pFVar1;
  int iVar2;
  Fts5TokenDataMap *nBytes;
  int iVar3;
  
  if (p->rc != 0) {
    return;
  }
  iVar2 = pT->nMapAlloc;
  if (pT->nMap == iVar2) {
    iVar3 = 0x40;
    if (iVar2 != 0) {
      iVar3 = iVar2 * 2;
    }
    pFVar1 = pT->aMap;
    iVar2 = sqlite3_initialize();
    nBytes = (Fts5TokenDataMap *)0x0;
    if (iVar2 == 0) {
      if (0 < iVar3 * 0x18) {
        nBytes = (Fts5TokenDataMap *)(ulong)(uint)(iVar3 * 0x18);
      }
      nBytes = (Fts5TokenDataMap *)sqlite3Realloc(pFVar1,(u64)nBytes);
    }
    if (nBytes == (Fts5TokenDataMap *)0x0) {
      p->rc = 7;
      return;
    }
    pT->aMap = nBytes;
    pT->nMapAlloc = iVar3;
  }
  pFVar1 = pT->aMap;
  iVar2 = pT->nMap;
  pFVar1[iVar2].iRowid = iRowid;
  pFVar1[iVar2].iPos = iPos;
  pFVar1[iVar2].iIter = iIter;
  pFVar1[iVar2].nByte = nByte;
  pT->nMap = iVar2 + 1;
  return;
}

Assistant:

static void fts5TokendataIterAppendMap(
  Fts5Index *p,
  Fts5TokenDataIter *pT,
  int iIter,
  int nByte,
  i64 iRowid,
  i64 iPos
){
  if( p->rc==SQLITE_OK ){
    if( pT->nMap==pT->nMapAlloc ){
      int nNew = pT->nMapAlloc ? pT->nMapAlloc*2 : 64;
      int nAlloc = nNew * sizeof(Fts5TokenDataMap);
      Fts5TokenDataMap *aNew;

      aNew = (Fts5TokenDataMap*)sqlite3_realloc(pT->aMap, nAlloc);
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        return;
      }

      pT->aMap = aNew;
      pT->nMapAlloc = nNew;
    }

    pT->aMap[pT->nMap].iRowid = iRowid;
    pT->aMap[pT->nMap].iPos = iPos;
    pT->aMap[pT->nMap].iIter = iIter;
    pT->aMap[pT->nMap].nByte = nByte;
    pT->nMap++;
  }
}